

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O1

void __thiscall RK8::Step(RK8 *this,double t,Mat *y,double h,Mat *u)

{
  code *pcVar1;
  Mat *rhs;
  double dVar2;
  Mat MStack_2d8;
  Mat local_2c8;
  Mat local_2b8;
  double local_2a8;
  Mat local_2a0;
  Mat local_290;
  Mat local_280;
  Mat local_270;
  Mat local_260;
  Mat local_250;
  Mat *local_240;
  double local_238;
  Mat local_230;
  Mat local_220;
  RK8 *local_210;
  Mat local_208;
  Mat local_1f8;
  RK8 *local_1e8;
  RK8 *local_1e0;
  RK8 *local_1d8;
  Mat local_1d0;
  Mat local_1c0;
  RK8 *local_1b0;
  double local_1a8;
  Mat local_1a0;
  Mat local_190;
  Mat local_180;
  Mat local_170;
  Mat local_160;
  Mat local_150;
  Mat local_140;
  Mat local_130;
  Mat local_120;
  Mat local_110;
  Mat local_100;
  Mat local_f0;
  Mat local_e0;
  Mat local_d0;
  Mat local_c0;
  Mat local_b0;
  Mat local_a0;
  Mat local_90;
  Mat local_80;
  Mat local_70;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  pcVar1 = *(code **)(this + 0x30);
  local_2a8 = h;
  local_240 = y;
  local_238 = t;
  Mat::Mat(&local_50,y);
  Mat::Mat(&local_60,u);
  (*pcVar1)(local_238,&local_50,this + 0x78,&local_60);
  Mat::~Mat(&local_60);
  Mat::~Mat(&local_50);
  pcVar1 = *(code **)(this + 0x30);
  operator*(&local_2b8,4.0);
  operator/(&MStack_2d8,27.0);
  operator*(&local_2c8,local_2a8);
  operator+(&local_70,local_240);
  Mat::Mat(&local_80,u);
  (*pcVar1)((local_2a8 * 4.0) / 27.0 + local_238,&local_70,this + 0x88,&local_80);
  Mat::~Mat(&local_80);
  Mat::~Mat(&local_70);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  pcVar1 = *(code **)(this + 0x30);
  operator/(&local_2b8,18.0);
  operator/(&local_2a0,6.0);
  operator+(&MStack_2d8,&local_2b8);
  operator*(&local_2c8,local_2a8);
  operator+(&local_90,local_240);
  Mat::Mat(&local_a0,u);
  local_210 = (RK8 *)(local_2a8 + local_2a8);
  (*pcVar1)((double)local_210 / 9.0 + local_238,&local_90,this + 0x98,&local_a0);
  Mat::~Mat(&local_a0);
  Mat::~Mat(&local_90);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_2b8);
  pcVar1 = *(code **)(this + 0x30);
  operator/(&local_2b8,12.0);
  local_1d8 = this + 0x98;
  operator*(&local_2a0,0.25);
  operator+(&MStack_2d8,&local_2b8);
  operator*(&local_2c8,local_2a8);
  operator+(&local_b0,local_240);
  Mat::Mat(&local_c0,u);
  (*pcVar1)(local_2a8 / 3.0 + local_238,&local_b0,this + 0xa8,&local_c0);
  Mat::~Mat(&local_c0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_2b8);
  pcVar1 = *(code **)(this + 0x30);
  operator/(&local_2b8,8.0);
  local_1e0 = this + 0xa8;
  operator*(&local_290,3.0);
  operator*(&local_2a0,0.125);
  operator+(&MStack_2d8,&local_2b8);
  operator*(&local_2c8,local_2a8);
  operator+(&local_d0,local_240);
  Mat::Mat(&local_e0,u);
  local_1e8 = this + 0xb8;
  (*pcVar1)(local_2a8 * 0.5 + local_238,&local_d0,local_1e8,&local_e0);
  Mat::~Mat(&local_e0);
  Mat::~Mat(&local_d0);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_2b8);
  pcVar1 = *(code **)(this + 0x30);
  operator*(&local_250,13.0);
  operator*(&local_260,27.0);
  operator-(&local_290,&local_250);
  operator*(&local_270,42.0);
  operator+(&local_2a0,&local_290);
  operator*(&local_280,8.0);
  operator+(&local_2b8,&local_2a0);
  operator*(&MStack_2d8,local_2a8);
  operator/(&local_2c8,54.0);
  operator+(&local_f0,local_240);
  Mat::Mat(&local_100,u);
  dVar2 = (double)local_210 / 3.0;
  local_210 = this + 200;
  (*pcVar1)(dVar2 + local_238,&local_f0,local_210,&local_100);
  Mat::~Mat(&local_100);
  Mat::~Mat(&local_f0);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  Mat::~Mat(&local_280);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_270);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_260);
  Mat::~Mat(&local_250);
  pcVar1 = *(code **)(this + 0x30);
  operator*(&local_260,389.0);
  operator*(&local_270,54.0);
  operator-(&local_250,&local_260);
  operator*(&local_280,966.0);
  operator+(&local_290,&local_250);
  operator*(&local_220,824.0);
  operator-(&local_2a0,&local_290);
  operator*(&local_230,243.0);
  operator+(&local_2b8,&local_2a0);
  operator*(&MStack_2d8,local_2a8);
  operator/(&local_2c8,4320.0);
  operator+(&local_110,local_240);
  Mat::Mat(&local_120,u);
  local_1b0 = this + 0xd8;
  (*pcVar1)(local_2a8 / 6.0 + local_238,&local_110,local_1b0,&local_120);
  Mat::~Mat(&local_120);
  Mat::~Mat(&local_110);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  Mat::~Mat(&local_230);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_220);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_280);
  Mat::~Mat(&local_250);
  Mat::~Mat(&local_270);
  Mat::~Mat(&local_260);
  pcVar1 = *(code **)(this + 0x30);
  operator*(&local_270,-231.0);
  operator*(&local_280,81.0);
  operator+(&local_260,&local_270);
  operator*(&local_220,1164.0);
  operator-(&local_250,&local_260);
  operator*(&local_230,656.0);
  operator+(&local_290,&local_250);
  operator*(&local_1f8,122.0);
  operator-(&local_2a0,&local_290);
  operator*(&local_208,800.0);
  operator+(&local_2b8,&local_2a0);
  operator*(&MStack_2d8,local_2a8);
  operator*(&local_2c8,0.05);
  operator+(&local_130,local_240);
  Mat::Mat(&local_140,u);
  local_1a8 = local_238 + local_2a8;
  (*pcVar1)(&local_130,this + 0xe8,&local_140);
  Mat::~Mat(&local_140);
  Mat::~Mat(&local_130);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  Mat::~Mat(&local_208);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_1f8);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_230);
  Mat::~Mat(&local_250);
  Mat::~Mat(&local_220);
  Mat::~Mat(&local_260);
  Mat::~Mat(&local_280);
  Mat::~Mat(&local_270);
  pcVar1 = *(code **)(this + 0x30);
  operator*(&local_280,-127.0);
  operator*(&local_220,18.0);
  operator+(&local_270,&local_280);
  operator*(&local_230,678.0);
  operator-(&local_260,&local_270);
  operator*(&local_1f8,456.0);
  operator+(&local_250,&local_260);
  operator*(&local_208,9.0);
  operator-(&local_290,&local_250);
  operator*(&local_1c0,576.0);
  operator+(&local_2a0,&local_290);
  operator*(&local_1d0,4.0);
  operator+(&local_2b8,&local_2a0);
  operator*(&MStack_2d8,local_2a8);
  operator/(&local_2c8,288.0);
  operator+(&local_150,local_240);
  Mat::Mat(&local_160,u);
  (*pcVar1)((local_2a8 * 5.0) / 6.0 + local_238,&local_150,this + 0xf8,&local_160);
  Mat::~Mat(&local_160);
  Mat::~Mat(&local_150);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  Mat::~Mat(&local_1d0);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_1c0);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_208);
  Mat::~Mat(&local_250);
  Mat::~Mat(&local_1f8);
  Mat::~Mat(&local_260);
  Mat::~Mat(&local_230);
  Mat::~Mat(&local_270);
  Mat::~Mat(&local_220);
  Mat::~Mat(&local_280);
  pcVar1 = *(code **)(this + 0x30);
  operator*(&local_220,1481.0);
  operator*(&local_230,81.0);
  operator-(&local_280,&local_220);
  operator*(&local_1f8,7104.0);
  operator+(&local_270,&local_280);
  operator*(&local_208,3376.0);
  operator-(&local_260,&local_270);
  operator*(&local_1c0,72.0);
  operator+(&local_250,&local_260);
  operator*(&local_1d0,5040.0);
  operator-(&local_290,&local_250);
  operator*(&local_180,60.0);
  operator-(&local_2a0,&local_290);
  operator*(&local_190,720.0);
  operator+(&local_2b8,&local_2a0);
  operator*(&MStack_2d8,local_2a8);
  operator/(&local_2c8,820.0);
  operator+(&local_170,local_240);
  Mat::Mat(&local_1a0,u);
  (*pcVar1)(local_1a8,&local_170,this + 0x108,&local_1a0);
  Mat::~Mat(&local_1a0);
  Mat::~Mat(&local_170);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  Mat::~Mat(&local_190);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_180);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_1d0);
  Mat::~Mat(&local_250);
  Mat::~Mat(&local_1c0);
  Mat::~Mat(&local_260);
  Mat::~Mat(&local_208);
  Mat::~Mat(&local_270);
  Mat::~Mat(&local_1f8);
  Mat::~Mat(&local_280);
  Mat::~Mat(&local_230);
  Mat::~Mat(&local_220);
  operator*(&local_280,41.0);
  operator*(&local_220,27.0);
  operator+(&local_270,&local_280);
  operator*(&local_230,272.0);
  operator+(&local_260,&local_270);
  operator*(&local_1f8,27.0);
  operator+(&local_250,&local_260);
  operator*(&local_208,216.0);
  operator+(&local_290,&local_250);
  operator*(&local_1c0,216.0);
  operator+(&local_2a0,&local_290);
  operator*(&local_1d0,41.0);
  operator+(&local_2b8,&local_2a0);
  operator*(&MStack_2d8,local_2a8 / 840.0);
  rhs = local_240;
  operator+(&local_2c8,local_240);
  Mat::operator=(&local_40,rhs);
  Mat::~Mat(&local_40);
  Mat::~Mat(&local_2c8);
  Mat::~Mat(&MStack_2d8);
  Mat::~Mat(&local_2b8);
  Mat::~Mat(&local_1d0);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_1c0);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_208);
  Mat::~Mat(&local_250);
  Mat::~Mat(&local_1f8);
  Mat::~Mat(&local_260);
  Mat::~Mat(&local_230);
  Mat::~Mat(&local_270);
  Mat::~Mat(&local_220);
  Mat::~Mat(&local_280);
  *(int *)this = *(int *)this + 10;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  return;
}

Assistant:

void RK8::Step(double t, Mat y, double h, Mat u) {	
	f_(t           , y                                                                                                        , k_1_,   u);
	f_(t+h*4.0/27.0, y+(k_1_*4.0/27.0)*h                                                                                      , k_2_,   u);
	f_(t+h*2.0/9.0 , y+(k_1_/18.0   +k_2_/6.0)*h                                                                              , k_3_,   u);
	f_(t+h/3.0     , y+(k_1_/12.0   +k_3_*0.25)*h                                                                             , k_4_,   u);
	f_(t+h*0.5     , y+(k_1_/8.0    +k_4_*3.0*0.125)*h                                                                        , k_5_,   u);
	f_(t+h*2.0/3.0 , y+(k_1_*13.0   -k_3_*27.0 +k_4_*42.0  +k_5_*8.0)*h/54.0                                                  , k_6_,   u);
	f_(t+h*1.0/6.0 , y+(k_1_*389.0  -k_3_*54.0 +k_4_*966.0 -k_5_*824.0  +k_6_*243.0)*h/4320.0                                 , k_7_,   u);
	f_(t+h         , y+(k_1_*-231.0 +k_3_*81.0 -k_4_*1164.0+k_5_*656.0  -k_6_*122.0+k_7_*800.0)*h*0.05                        , k_8_,   u);
	f_(t+h*5.0/6.0 , y+(k_1_*-127.0 +k_3_*18.0 -k_4_*678.0 +k_5_*456.0  -k_6_*9.0  +k_7_*576.0 +k_8_*4.0)*h/288.0             , k_9_,   u);
	f_(t+h         , y+(k_1_*1481.0 -k_3_*81.0 +k_4_*7104.0-k_5_*3376.0 +k_6_*72.0 -k_7_*5040.0-k_8_*60.0+k_9_*720.0)*h/820.0 , k_10_,  u);
	y = y + (k_1_*41.0 + k_4_*27 + k_5_*272.0 + k_6_*27.0+k_7_*216.0+ k_9_*216.0+k_10_*41.0 )*(h/840.0);
	t = t + h; // Update independent variable
	n_fevals_ += 10;
	n_steps_ += 1;
 }